

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjLoader.cpp
# Opt level: O0

bool __thiscall PackedVertexPNTCUV::operator==(PackedVertexPNTCUV *this,PackedVertexPNTCUV *other)

{
  bool bVar1;
  bool local_19;
  PackedVertexPNTCUV *other_local;
  PackedVertexPNTCUV *this_local;
  
  bVar1 = is_near(&this->position,&other->position);
  local_19 = false;
  if (bVar1) {
    bVar1 = is_near(&this->normal,&other->normal);
    local_19 = false;
    if (bVar1) {
      bVar1 = is_near(&this->tangent,&other->tangent);
      local_19 = false;
      if (bVar1) {
        bVar1 = is_near(&this->uv,&other->uv);
        local_19 = false;
        if (bVar1) {
          local_19 = is_near(&this->color,&other->color);
        }
      }
    }
  }
  return local_19;
}

Assistant:

bool operator==(const PackedVertexPNTCUV & other) const
  {
    return is_near(position, other.position) and is_near(normal, other.normal) and is_near(tangent, other.tangent) and is_near(uv, other.uv) and is_near(color, other.color);
  }